

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::convert_non_uniform_expression
          (CompilerGLSL *this,string *expr,uint32_t ptr_id)

{
  char cVar1;
  SPIRVariable *pSVar2;
  SPIRType *pSVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  
  if (*(this->backend).nonuniform_qualifier != '\0') {
    pSVar2 = Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr_id);
    if (((pSVar2 != (SPIRVariable *)0x0) && (pSVar2->storage < (StorageBuffer|Input))) &&
       ((0x1005U >> (pSVar2->storage & 0x1f) & 1) != 0)) {
      pSVar3 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar2->super_IVariant).field_0xc);
      if ((pSVar3->array).super_VectorView<unsigned_int>.buffer_size != 0) {
        uVar4 = ::std::__cxx11::string::find((char)expr,0x5b);
        if (uVar4 != 0xffffffffffffffff) {
          uVar5 = uVar4 + 1;
          uVar7 = 0xffffffffffffffff;
          if (uVar5 < expr->_M_string_length) {
            iVar6 = 1;
            do {
              cVar1 = (expr->_M_dataplus)._M_p[uVar5];
              if (cVar1 == ']') {
                iVar6 = iVar6 + -1;
                if (iVar6 == 0) {
                  bVar8 = true;
                  uVar7 = uVar5;
                  goto LAB_00332821;
                }
              }
              else {
                iVar6 = iVar6 + (uint)(cVar1 == '[');
              }
              uVar5 = uVar5 + 1;
            } while (expr->_M_string_length != uVar5);
            bVar8 = iVar6 == 0;
          }
          else {
            bVar8 = false;
          }
LAB_00332821:
          if (!bVar8) {
            __assert_fail("bracket_count == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                          ,0x4767,
                          "void spirv_cross::CompilerGLSL::convert_non_uniform_expression(string &, uint32_t)"
                         );
          }
          if (uVar4 <= uVar7 && uVar7 != 0xffffffffffffffff) {
            ::std::__cxx11::string::substr((ulong)(local_90 + 0x10),(ulong)expr);
            ::std::__cxx11::string::substr((ulong)&stack0xffffffffffffff60,(ulong)expr);
            ::std::__cxx11::string::substr((ulong)local_60,(ulong)expr);
            join<std::__cxx11::string,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                      (&local_40,(spirv_cross *)(local_90 + 0x10),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &(this->backend).nonuniform_qualifier,(char **)0x40a721,
                       (char (*) [2])&stack0xffffffffffffff60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415df5
                       ,(char (*) [2])local_60,in_stack_ffffffffffffff60);
            ::std::__cxx11::string::operator=((string *)expr,(string *)&local_40);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_40._M_dataplus._M_p != &local_40.field_2) {
              operator_delete(local_40._M_dataplus._M_p);
            }
            if (local_60[0] != local_50) {
              operator_delete(local_60[0]);
            }
            if (in_stack_ffffffffffffff60 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90) {
              operator_delete(in_stack_ffffffffffffff60);
            }
            if ((undefined1 *)local_80._M_allocated_capacity != local_70) {
              operator_delete((void *)local_80._M_allocated_capacity);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::convert_non_uniform_expression(string &expr, uint32_t ptr_id)
{
	if (*backend.nonuniform_qualifier == '\0')
		return;

	auto *var = maybe_get_backing_variable(ptr_id);
	if (!var)
		return;

	if (var->storage != StorageClassUniformConstant &&
	    var->storage != StorageClassStorageBuffer &&
	    var->storage != StorageClassUniform)
		return;

	auto &backing_type = get<SPIRType>(var->basetype);
	if (backing_type.array.empty())
		return;

	// If we get here, we know we're accessing an arrayed resource which
	// might require nonuniform qualifier.

	auto start_array_index = expr.find_first_of('[');

	if (start_array_index == string::npos)
		return;

	// We've opened a bracket, track expressions until we can close the bracket.
	// This must be our resource index.
	size_t end_array_index = string::npos;
	unsigned bracket_count = 1;
	for (size_t index = start_array_index + 1; index < expr.size(); index++)
	{
		if (expr[index] == ']')
		{
			if (--bracket_count == 0)
			{
				end_array_index = index;
				break;
			}
		}
		else if (expr[index] == '[')
			bracket_count++;
	}

	assert(bracket_count == 0);

	// Doesn't really make sense to declare a non-arrayed image with nonuniformEXT, but there's
	// nothing we can do here to express that.
	if (start_array_index == string::npos || end_array_index == string::npos || end_array_index < start_array_index)
		return;

	start_array_index++;

	expr = join(expr.substr(0, start_array_index), backend.nonuniform_qualifier, "(",
	            expr.substr(start_array_index, end_array_index - start_array_index), ")",
	            expr.substr(end_array_index, string::npos));
}